

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
OnDiskIndex::read_run_offsets(OnDiskIndex *this)

{
  allocator_type *this_00;
  unsigned_long *puVar1;
  allocator_type *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  __off_t in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *run_offsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffee;
  __n = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1b4b69);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_01,(size_type)__n,in_RSI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1b4b89);
  this_00 = in_RSI + 0x68;
  puVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b4ba1);
  RawFile::pread((RawFile *)this_00,(int)puVar1,(void *)0x8000008,*(long *)in_RSI - 0x8000008,in_R8)
  ;
  return in_RDI;
}

Assistant:

std::vector<uint64_t> OnDiskIndex::read_run_offsets() const {
    std::vector<uint64_t> run_offsets(NUM_TRIGRAMS + 1);
    ndxfile.pread(run_offsets.data(), RUN_ARRAY_SIZE,
                  index_size - RUN_ARRAY_SIZE);
    return run_offsets;
}